

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O0

void __thiscall OpenMD::NPAT::NPAT(NPAT *this,SimInfo *info)

{
  byte bVar1;
  byte bVar2;
  undefined8 *in_RDI;
  SimInfo *in_stack_00000088;
  NPT *in_stack_00000090;
  Globals *simParams;
  Globals *in_stack_ffffffffffffff38;
  undefined5 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  Globals *local_28;
  
  NPT::NPT(in_stack_00000090,in_stack_00000088);
  *in_RDI = &PTR__NPAT_004ffd28;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x20ba41);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x20ba59);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x20ba71);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x20ba89);
  local_28 = SimInfo::getSimParams((SimInfo *)in_RDI[0xe]);
  Globals::getPrivilegedAxis_abi_cxx11_(in_stack_ffffffffffffff38);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,
                                            CONCAT15(in_stack_ffffffffffffff45,
                                                     in_stack_ffffffffffffff40))),
                          (char *)in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_48);
  if ((bVar1 & 1) == 0) {
    Globals::getPrivilegedAxis_abi_cxx11_(in_stack_ffffffffffffff38);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff46,
                                                    CONCAT15(in_stack_ffffffffffffff45,
                                                             in_stack_ffffffffffffff40))),
                            (char *)in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(local_68);
    if ((bVar2 & 1) == 0) {
      Globals::getPrivilegedAxis_abi_cxx11_(in_stack_ffffffffffffff38);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffff45,
                                                                     in_stack_ffffffffffffff40))),
                              (char *)in_stack_ffffffffffffff38);
      std::__cxx11::string::~string(local_88);
      if ((bVar1 & 1) != 0) {
        *(undefined4 *)(in_RDI + 0x65) = 2;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x65) = 1;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x65) = 0;
  }
  return;
}

Assistant:

NPAT::NPAT(SimInfo* info) : NPT(info) {
    Globals* simParams = info_->getSimParams();

    // Default value of privilegedAxis is "z"
    if (simParams->getPrivilegedAxis() == "x")
      axis_ = 0;
    else if (simParams->getPrivilegedAxis() == "y")
      axis_ = 1;
    else if (simParams->getPrivilegedAxis() == "z")
      axis_ = 2;
  }